

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O2

void kratos::LiftGenVarInstanceVisitor::create_gen_var_instance
               (vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
                *generators,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
               *port_mapping)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  __shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer ppMVar1;
  element_type *peVar2;
  pointer psVar3;
  pointer psVar4;
  undefined1 auVar5 [8];
  undefined8 uVar6;
  ModuleInstantiationStmt *pMVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  undefined1 auVar9 [8];
  Generator *pGVar10;
  long lVar11;
  vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
  *generators_00;
  pointer ppMVar12;
  __node_base *p_Var13;
  shared_ptr<kratos::AssignStmt> sVar14;
  undefined1 local_188 [8];
  string new_var;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_160;
  undefined1 auStack_158 [8];
  value_type mapping;
  undefined1 local_e0 [8];
  string blk_name;
  __shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2> local_b0;
  __shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> local_a0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  ModuleInstantiationStmt *local_90;
  __weak_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *local_88;
  __node_base *local_80;
  undefined1 auStack_78 [8];
  shared_ptr<kratos::Var> target_var;
  shared_ptr<kratos::ForStmt> for_stmt;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  Generator *local_48;
  undefined1 auStack_40 [8];
  shared_ptr<kratos::Port> port;
  
  local_80 = (__node_base *)port_mapping;
  pGVar10 = Stmt::generator_parent
                      (&(*(generators->
                          super__Vector_base<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
                          )._M_impl.super__Vector_impl_data._M_start)->super_Stmt);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_158,"",
             (allocator<char> *)
             &target_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e0,"i",(allocator<char> *)&local_b0);
  local_48 = pGVar10;
  Generator::get_unique_variable_name
            ((string *)local_188,pGVar10,(string *)auStack_158,(string *)local_e0);
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string((string *)auStack_158);
  local_e0._0_4_ = 0;
  auStack_158 = (undefined1  [8])
                ((long)(generators->
                       super__Vector_base<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(generators->
                       super__Vector_base<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 3);
  local_b0._M_ptr._0_4_ = 1;
  std::make_shared<kratos::ForStmt,std::__cxx11::string_const&,int,unsigned_long,int>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &target_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (int *)local_188,(unsigned_long *)local_e0,(int *)auStack_158);
  std::__shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_b0,
             (__shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2> *)
             (target_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi + 0xc));
  *(undefined1 *)(CONCAT44(local_b0._M_ptr._4_4_,local_b0._M_ptr._0_4_) + 0x280) = 1;
  this_00 = (__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)((long)&new_var.field_2 + 8);
  std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::ForStmt,void>
            (this_00,(__shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2> *)
                     &target_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  Generator::add_stmt(local_48,(shared_ptr<kratos::Stmt> *)this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_160);
  find_common_instance_name_abi_cxx11_
            ((string *)local_e0,(LiftGenVarInstanceVisitor *)generators,generators_00);
  std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)auStack_40,
             (__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
             &target_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi[0xe]._M_use_count);
  auStack_158 = auStack_40;
  mapping.first._M_dataplus._M_p =
       (pointer)port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  auStack_40 = (undefined1  [8])0x0;
  port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  Generator::add_named_block
            (local_48,(string *)local_e0,(shared_ptr<kratos::StmtBlock> *)auStack_158);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&mapping);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&port);
  ppMVar12 = (generators->
             super__Vector_base<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppMVar1 = (generators->
            super__Vector_base<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_80 = &((_Hashtable *)&local_80->_M_nxt)->_M_before_begin;
  this = &for_stmt.super___shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  while( true ) {
    pGVar10 = local_48;
    _Var8._M_pi = target_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi;
    if (ppMVar12 == ppMVar1) break;
    local_90 = *ppMVar12;
    local_88 = (__weak_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)
               &(local_90->super_Stmt).super_enable_shared_from_this<kratos::Stmt>;
    std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Stmt,void>
              ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)auStack_158,local_88);
    std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>::
    emplace_back<std::shared_ptr<kratos::Stmt>const&>
              ((vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                *)&_Var8._M_pi[0xf]._M_use_count,(shared_ptr<kratos::Stmt> *)auStack_158);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&mapping);
    std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Stmt,void>
              ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)auStack_158,local_88);
    Generator::remove_stmt(pGVar10,(shared_ptr<kratos::Stmt> *)auStack_158);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&mapping);
    pMVar7 = local_90;
    (*(local_90->super_Stmt).super_IRNode._vptr_IRNode[7])
              (local_90,target_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi);
    mapping.second._M_h._M_single_bucket = (__node_base_ptr)pMVar7->target_;
    p_Var13 = local_80;
    while( true ) {
      p_Var13 = p_Var13->_M_nxt;
      if (p_Var13 == (__node_base *)0x0) break;
      Generator::get_port((Generator *)auStack_40,(string *)mapping.second._M_h._M_single_bucket);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
      ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
              *)auStack_158,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
              *)(p_Var13[7]._M_nxt + 1));
      Generator::get_var((Generator *)((long)&blk_name.field_2 + 8),(string *)pGVar10);
      uVar6 = blk_name.field_2._8_8_;
      auStack_78 = (undefined1  [8])0x0;
      target_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      if (mapping.second._M_h._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
        std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)auStack_78,
                   (__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&blk_name.field_2 + 8));
      }
      else {
        std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<kratos::IterVar,void>(local_a0,&local_b0);
        lVar11 = (**(code **)(*(long *)uVar6 + 0x50))(uVar6,local_a0);
        std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                  ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)this,
                   (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)(lVar11 + 0x68));
        std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)auStack_78,
                   (__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)this);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
      }
      peVar2 = (element_type *)(((Var *)auStack_40)->super_IRNode)._vptr_IRNode;
      if (*(PortDirection *)((long)auStack_40 + 0x270) == In) {
        lVar11 = (*(code *)(peVar2->name)._M_string_length)();
        std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<kratos::AssignStmt,void>
                  ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)this,
                   (__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *)
                   (*(long *)(lVar11 + 0x10) + 8));
        Generator::remove_stmt(pGVar10,(shared_ptr<kratos::Stmt> *)this);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
        (**(code **)((long)&(((element_type *)(((Var *)auStack_40)->super_IRNode)._vptr_IRNode)->
                            name).field_2 + 8))(auStack_40,0);
        auVar5 = auStack_40;
        sVar14 = Var::assign((Var *)this,(shared_ptr<kratos::Var> *)auStack_40);
        (*(code *)(((element_type *)(((Var *)auVar5)->super_IRNode)._vptr_IRNode)->size_).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage)
                  (auVar5,this,
                   sVar14.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi._M_pi);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
      }
      else {
        lVar11 = (*(code *)(peVar2->super_enable_shared_from_this<kratos::Var>)._M_weak_this.
                           super___weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)();
        std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<kratos::AssignStmt,void>
                  ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)this,
                   (__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *)
                   (*(long *)(lVar11 + 0x10) + 8));
        Generator::remove_stmt(pGVar10,(shared_ptr<kratos::Stmt> *)this);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
        auVar9 = auStack_40;
        auVar5 = auStack_78;
        std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Port,void>
                  (local_a0,(__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)auStack_40);
        sVar14 = Var::assign((Var *)this,(shared_ptr<kratos::Var> *)auVar5);
        (*(code *)(((element_type *)(((Var *)auVar9)->super_IRNode)._vptr_IRNode)->size_).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish)
                  (auVar9,this,
                   sVar14.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi._M_pi);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
        (*(code *)(((element_type *)(((Var *)auStack_40)->super_IRNode)._vptr_IRNode)->name).field_2
                  ._M_allocated_capacity)(auStack_40,0);
        pGVar10 = local_48;
      }
      InstantiationStmt::set_mapping
                (&pMVar7->super_InstantiationStmt,(Port *)auStack_40,(Var *)auStack_78);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&target_var);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff48);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
               *)auStack_158);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&port);
    }
    std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)auStack_158,
               (__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
               &target_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi[0xe]._M_use_count);
    psVar3 = (((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                *)((long)auStack_158 + 0xc0))->
             super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    psVar4 = *(pointer *)((long)auStack_158 + 200);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&mapping);
    if (psVar3 == psVar4) {
      std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)auStack_158,
                 (__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
                 &target_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi[0xe]._M_use_count);
      auVar5 = auStack_158;
      std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Stmt,void>
                ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)auStack_40,local_88);
      StmtBlock::add_stmt((StmtBlock *)auVar5,(shared_ptr<kratos::Stmt> *)auStack_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&port);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&mapping);
    }
    std::__cxx11::string::assign((char *)&local_90->target_->instance_name);
    ppMVar12 = ppMVar12 + 1;
  }
  std::__cxx11::string::~string((string *)local_e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&for_stmt);
  std::__cxx11::string::~string((string *)local_188);
  return;
}

Assistant:

static void create_gen_var_instance(
        const std::vector<ModuleInstantiationStmt*>& generators,
        const std::unordered_map<std::string, PortInfo>& port_mapping) {
        auto* gen = generators[0]->generator_parent();
        // need to allocate a var name
        auto const new_var = gen->get_unique_variable_name("", "i");
        // need to create a for loop with genvar loop variable
        auto for_stmt = std::make_shared<ForStmt>(new_var, 0, generators.size(), 1);
        // set it to gen var
        auto const& iter = for_stmt->get_iter_var();
        iter->set_is_gen_gar();
        gen->add_stmt(for_stmt);
        auto blk_name = find_common_instance_name(generators);
        gen->add_named_block(blk_name, for_stmt->get_loop_body());
        for (auto* inst : generators) {
            // remove statement first
            // const cast
            auto* s = const_cast<ModuleInstantiationStmt*>(inst);
            for_stmt->add_genvar_stmt(s->shared_from_this());
            gen->remove_stmt(s->shared_from_this());
            s->set_parent(for_stmt.get());
            auto const* child = inst->target();
            // need to rewrite all the connections
            // first we remove all of the connections
            // remote_stmt will take care of the connection if it doesn't exist
            for (auto const& [port_name, info] : port_mapping) {
                auto port = child->get_port(port_name);
                // get the target_var
                auto mapping = *info.begin();
                auto const& target_name = mapping.first;
                auto const& target_var_base = gen->get_var(target_name);
                std::shared_ptr<Var> target_var;
                if (mapping.second.empty()) {
                    target_var = target_var_base;
                } else {
                    target_var = target_var_base->operator[](iter).shared_from_this();
                }
                if (port->port_direction() == PortDirection::In) {
                    auto const& source_stmt = *port->sources().begin();
                    gen->remove_stmt(source_stmt);
                    port->clear_sources(false);
                    port->add_source(port->assign(target_var));
                } else {
                    auto const& sink_stmt = *port->sinks().begin();
                    gen->remove_stmt(sink_stmt);
                    port->add_sink(target_var->assign(port));
                    port->clear_sinks(false);
                }
                inst->set_mapping(port.get(), target_var.get());
            }
            // only need one instance
            if (for_stmt->get_loop_body()->empty()) {
                for_stmt->get_loop_body()->add_stmt(inst->shared_from_this());
            }

            // name all the instance name to inst
            // remove const cast hack
            auto* target_inst = const_cast<Generator*>(s->target());
            target_inst->instance_name = "inst";
        }
    }